

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CDict *
ZSTD_createCDict_advanced
          (void *dictBuffer,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_compressionParameters cParams,
          ZSTD_customMem customMem)

{
  uint uVar1;
  size_t sVar2;
  void *ptr;
  void *workspace;
  size_t workspaceSize;
  ZSTD_CDict *cdict;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dictBuffer_local;
  
  if ((customMem.customAlloc == (ZSTD_allocFunction)0x0) ==
      (customMem.customFree == (ZSTD_freeFunction)0x0)) {
    dictBuffer_local = ZSTD_malloc(0x1310,customMem);
    sVar2 = ZSTD_sizeof_matchState(&cParams,0);
    ptr = ZSTD_malloc(sVar2 + 0x1800,customMem);
    if (((ZSTD_CDict *)dictBuffer_local == (ZSTD_CDict *)0x0) || (ptr == (void *)0x0)) {
      ZSTD_free(dictBuffer_local,customMem);
      ZSTD_free(ptr,customMem);
      dictBuffer_local = (void *)0x0;
    }
    else {
      (((ZSTD_CDict *)dictBuffer_local)->customMem).customAlloc = customMem.customAlloc;
      (((ZSTD_CDict *)dictBuffer_local)->customMem).customFree = customMem.customFree;
      (((ZSTD_CDict *)dictBuffer_local)->customMem).opaque = customMem.opaque;
      ((ZSTD_CDict *)dictBuffer_local)->workspace = ptr;
      ((ZSTD_CDict *)dictBuffer_local)->workspaceSize = sVar2 + 0x1800;
      sVar2 = ZSTD_initCDict_internal
                        ((ZSTD_CDict *)dictBuffer_local,dictBuffer,dictSize,dictLoadMethod,
                         dictContentType,cParams);
      uVar1 = ERR_isError(sVar2);
      if (uVar1 != 0) {
        ZSTD_freeCDict((ZSTD_CDict *)dictBuffer_local);
        dictBuffer_local = (void *)0x0;
      }
    }
  }
  else {
    dictBuffer_local = (void *)0x0;
  }
  return (ZSTD_CDict *)dictBuffer_local;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced(const void* dictBuffer, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_compressionParameters cParams, ZSTD_customMem customMem)
{
    DEBUGLOG(3, "ZSTD_createCDict_advanced, mode %u", (unsigned)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    {   ZSTD_CDict* const cdict = (ZSTD_CDict*)ZSTD_malloc(sizeof(ZSTD_CDict), customMem);
        size_t const workspaceSize = HUF_WORKSPACE_SIZE + ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0);
        void* const workspace = ZSTD_malloc(workspaceSize, customMem);

        if (!cdict || !workspace) {
            ZSTD_free(cdict, customMem);
            ZSTD_free(workspace, customMem);
            return NULL;
        }
        cdict->customMem = customMem;
        cdict->workspace = workspace;
        cdict->workspaceSize = workspaceSize;
        if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                        dictBuffer, dictSize,
                                        dictLoadMethod, dictContentType,
                                        cParams) )) {
            ZSTD_freeCDict(cdict);
            return NULL;
        }

        return cdict;
    }
}